

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablebyte.h
# Opt level: O2

uint8_t * __thiscall
FastPForLib::VariableByte::decodeFromByteArray<unsigned_int>
          (VariableByte *this,uint8_t *inbyte,size_t length,uint *out,size_t *nvalue)

{
  byte bVar1;
  ulong uVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint *puVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  
  if (length == 0) {
    sVar6 = 0;
  }
  else {
    pbVar4 = inbyte + length;
    puVar5 = out;
    while (pbVar3 = inbyte + 10, pbVar3 < pbVar4) {
      bVar1 = *inbyte;
      if ((char)bVar1 < '\0') {
        uVar9 = bVar1 & 0x7f;
        pbVar3 = inbyte + 1;
      }
      else {
        uVar9 = (inbyte[1] & 0x7f) << 7 | (uint)bVar1;
        if ((char)inbyte[1] < '\0') {
          pbVar3 = inbyte + 2;
        }
        else {
          uVar9 = (inbyte[2] & 0x7f) << 0xe | uVar9;
          if ((char)inbyte[2] < '\0') {
            pbVar3 = inbyte + 3;
          }
          else {
            uVar9 = (inbyte[3] & 0x7f) << 0x15 | uVar9;
            if ((char)inbyte[3] < '\0') {
              pbVar3 = inbyte + 4;
            }
            else {
              uVar9 = (uint)inbyte[4] << 0x1c | uVar9;
              if ((char)inbyte[4] < '\0') {
                pbVar3 = inbyte + 5;
              }
              else if ((char)inbyte[5] < '\0') {
                pbVar3 = inbyte + 6;
              }
              else if ((char)inbyte[6] < '\0') {
                pbVar3 = inbyte + 7;
              }
              else if ((char)inbyte[7] < '\0') {
                pbVar3 = inbyte + 8;
              }
              else if ((char)inbyte[8] < '\0') {
                pbVar3 = inbyte + 9;
              }
            }
          }
        }
      }
      *puVar5 = uVar9;
      puVar5 = puVar5 + 1;
      inbyte = pbVar3;
    }
LAB_001515af:
    if (inbyte < pbVar4) {
      uVar7 = 0;
      lVar8 = 0;
      do {
        if (pbVar4 <= inbyte) goto LAB_001515af;
        bVar1 = *inbyte;
        inbyte = inbyte + 1;
        uVar2 = uVar7 & 0x3f;
        uVar7 = (ulong)((int)uVar7 + 7);
        lVar8 = lVar8 + ((ulong)(bVar1 & 0x7f) << uVar2);
      } while (-1 < (char)bVar1);
      *puVar5 = (uint)lVar8;
      puVar5 = puVar5 + 1;
      goto LAB_001515af;
    }
    sVar6 = (long)puVar5 - (long)out >> 2;
  }
  *nvalue = sVar6;
  return inbyte;
}

Assistant:

const uint8_t *decodeFromByteArray(const uint8_t *inbyte, const size_t length,
                                     T *out, size_t &nvalue) {
    if (length == 0) {
      nvalue = 0;
      return inbyte;  // abort
    }
    const uint8_t *const endbyte = inbyte + length;
    const T *const initout(out);
    // this assumes that there is a value to be read

    while (endbyte > inbyte + 10) {
      uint64_t c;
      T v = 0;

      c = inbyte[0];
      v = c & 0x7F;
      if (c >= 128) {
        inbyte += 1;
        *out++ = v;
        continue;
      }

      c = inbyte[1];
      v |= (c & 0x7F) << 7;
      if (c >= 128) {
        inbyte += 2;
        *out++ = v;
        continue;
      }

      c = inbyte[2];
      v |= (c & 0x7F) << 14;
      if (c >= 128) {
        inbyte += 3;
        *out++ = v;
        continue;
      }

      c = inbyte[3];
      v |= (c & 0x7F) << 21;
      if (c >= 128) {
        inbyte += 4;
        *out++ = v;
        continue;
      }

      c = inbyte[4];
      v |= (c & 0x7F) << 28;
      if (c >= 128) {
        inbyte += 5;
        *out++ = v;
        continue;
      }

      c = inbyte[5];
      v |= static_cast<uint64_t>(c & 0x7F) << 35;
      if (c >= 128) {
        inbyte += 6;
        *out++ = v;
        continue;
      }

      c = inbyte[6];
      v |= static_cast<uint64_t>(c & 0x7F) << 42;
      if (c >= 128) {
        inbyte += 7;
        *out++ = v;
        continue;
      }

      c = inbyte[7];
      v |= static_cast<uint64_t>(c & 0x7F) << 49;
      if (c >= 128) {
        inbyte += 8;
        *out++ = v;
        continue;
      }

      c = inbyte[8];
      v |= static_cast<uint64_t>(c & 0x7F) << 56;
      if (c >= 128) {
        inbyte += 9;
        *out++ = v;
        continue;
      }

      c = inbyte[9];
      inbyte += 10;
      v |= static_cast<uint64_t>(c & 0x1) << 63;
      *out++ = v;
    }

    while (endbyte > inbyte) {
      unsigned int shift = 0;
      for (T v = 0; endbyte > inbyte; shift += 7) {
        uint64_t c = *inbyte++;
        v += ((c & 127) << shift);
        if ((c & 128)) {
          *out++ = v;
          break;
        }
      }
    }
    nvalue = out - initout;
    return inbyte;
  }